

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmGraph.cpp
# Opt level: O0

void PrintBlock(InstructionVMGraphContext *ctx,VmBlock *block)

{
  VmBlock *pVVar1;
  VmInstruction *pVVar2;
  bool bVar3;
  uint uVar4;
  VmBlock **ppVVar5;
  VmInstruction **ppVVar6;
  char *pcVar7;
  byte *pbVar8;
  VmValue **ppVVar9;
  VmInstruction *pVVar10;
  VmInstruction *local_98;
  VmInstruction *value_1;
  uint i_8;
  VmInstruction *liveOut;
  uint i_7;
  uint i_6;
  VmInstruction *value;
  uint k;
  uint i_5;
  VmInstruction *liveIn;
  uint i_4;
  VmBlock *dominator_1;
  uint i_3;
  VmBlock *dominator;
  uint i_2;
  VmBlock *successor;
  uint i_1;
  VmBlock *predecessor;
  uint i;
  VmBlock *block_local;
  InstructionVMGraphContext *ctx_local;
  
  PrintUsers(ctx,&block->super_VmValue,false);
  PrintLine(ctx,"%.*s.b%d:",(ulong)(uint)((int)(block->name).end - (int)(block->name).begin),
            (block->name).begin,(ulong)block->uniqueId);
  ctx->depth = ctx->depth + 1;
  Print(ctx,"  // predecessor blocks: [");
  for (predecessor._4_4_ = 0; uVar4 = SmallArray<VmBlock_*,_4U>::size(&block->predecessors),
      predecessor._4_4_ < uVar4; predecessor._4_4_ = predecessor._4_4_ + 1) {
    ppVVar5 = SmallArray<VmBlock_*,_4U>::operator[](&block->predecessors,predecessor._4_4_);
    pVVar1 = *ppVVar5;
    if (predecessor._4_4_ != 0) {
      Print(ctx,", ");
    }
    Print(ctx,"\'%.*s.b%d\'",(ulong)(uint)((int)(pVVar1->name).end - (int)(pVVar1->name).begin),
          (pVVar1->name).begin,(ulong)pVVar1->uniqueId);
  }
  PrintLine(ctx,"]");
  Print(ctx,"  // successor blocks: [");
  for (successor._4_4_ = 0; uVar4 = SmallArray<VmBlock_*,_4U>::size(&block->successors),
      successor._4_4_ < uVar4; successor._4_4_ = successor._4_4_ + 1) {
    ppVVar5 = SmallArray<VmBlock_*,_4U>::operator[](&block->successors,successor._4_4_);
    pVVar1 = *ppVVar5;
    if (successor._4_4_ != 0) {
      Print(ctx,", ");
    }
    Print(ctx,"\'%.*s.b%d\'",(ulong)(uint)((int)(pVVar1->name).end - (int)(pVVar1->name).begin),
          (pVVar1->name).begin,(ulong)pVVar1->uniqueId);
  }
  PrintLine(ctx,"]");
  Print(ctx,"  // immediate dominator: [");
  if (block->idom != (VmBlock *)0x0) {
    Print(ctx,"\'%.*s.b%d\'",
          (ulong)(uint)((int)(block->idom->name).end - (int)(block->idom->name).begin),
          (block->idom->name).begin,(ulong)block->idom->uniqueId);
  }
  PrintLine(ctx,"]");
  Print(ctx,"  // dominance frontier: [");
  for (dominator._4_4_ = 0; uVar4 = SmallArray<VmBlock_*,_4U>::size(&block->dominanceFrontier),
      dominator._4_4_ < uVar4; dominator._4_4_ = dominator._4_4_ + 1) {
    ppVVar5 = SmallArray<VmBlock_*,_4U>::operator[](&block->dominanceFrontier,dominator._4_4_);
    pVVar1 = *ppVVar5;
    if (dominator._4_4_ != 0) {
      Print(ctx,", ");
    }
    Print(ctx,"\'%.*s.b%d\'",(ulong)(uint)((int)(pVVar1->name).end - (int)(pVVar1->name).begin),
          (pVVar1->name).begin,(ulong)pVVar1->uniqueId);
  }
  PrintLine(ctx,"]");
  Print(ctx,"  // dominance children: [");
  for (dominator_1._4_4_ = 0; uVar4 = SmallArray<VmBlock_*,_4U>::size(&block->dominanceChildren),
      dominator_1._4_4_ < uVar4; dominator_1._4_4_ = dominator_1._4_4_ + 1) {
    ppVVar5 = SmallArray<VmBlock_*,_4U>::operator[](&block->dominanceChildren,dominator_1._4_4_);
    pVVar1 = *ppVVar5;
    if (dominator_1._4_4_ != 0) {
      Print(ctx,", ");
    }
    Print(ctx,"\'%.*s.b%d\'",(ulong)(uint)((int)(pVVar1->name).end - (int)(pVVar1->name).begin),
          (pVVar1->name).begin,(ulong)pVVar1->uniqueId);
  }
  PrintLine(ctx,"]");
  Print(ctx,"  // live variables going in: [");
  for (liveIn._4_4_ = 0; uVar4 = SmallArray<VmInstruction_*,_4U>::size(&block->liveIn),
      liveIn._4_4_ < uVar4; liveIn._4_4_ = liveIn._4_4_ + 1) {
    ppVVar6 = SmallArray<VmInstruction_*,_4U>::operator[](&block->liveIn,liveIn._4_4_);
    pVVar2 = *ppVVar6;
    if (liveIn._4_4_ != 0) {
      Print(ctx,", ");
    }
    if (pVVar2->cmd == VM_INST_PHI) {
      Print(ctx,"%%%d",(ulong)pVVar2->uniqueId);
      if (pVVar2->color != 0) {
        Print(ctx,".c%d",(ulong)pVVar2->color);
      }
      bVar3 = SmallArray<unsigned_char,_8U>::empty(&pVVar2->regVmRegisters);
      if (!bVar3) {
        Print(ctx,".r");
        for (value._4_4_ = 0; uVar4 = SmallArray<unsigned_char,_8U>::size(&pVVar2->regVmRegisters),
            value._4_4_ < uVar4; value._4_4_ = value._4_4_ + 1) {
          pcVar7 = "|%d";
          if (value._4_4_ == 0) {
            pcVar7 = "%d";
          }
          pbVar8 = SmallArray<unsigned_char,_8U>::operator[](&pVVar2->regVmRegisters,value._4_4_);
          Print(ctx,pcVar7,(ulong)*pbVar8);
        }
      }
      bVar3 = InplaceStr::empty(&(pVVar2->super_VmValue).comment);
      if (bVar3) {
        Print(ctx," [");
      }
      else {
        Print(ctx," (%.*s) [",
              (ulong)(uint)((int)(pVVar2->super_VmValue).comment.end -
                           (int)(pVVar2->super_VmValue).comment.begin),
              (pVVar2->super_VmValue).comment.begin);
      }
      for (value._0_4_ = 0; uVar4 = SmallArray<VmValue_*,_4U>::size(&pVVar2->arguments),
          (uint)value < uVar4; value._0_4_ = (uint)value + 2) {
        ppVVar9 = SmallArray<VmValue_*,_4U>::operator[](&pVVar2->arguments,(uint)value);
        pVVar10 = getType<VmInstruction>(*ppVVar9);
        if ((uint)value != 0) {
          Print(ctx,", ");
        }
        bVar3 = InplaceStr::empty(&(pVVar10->super_VmValue).comment);
        if (bVar3) {
          Print(ctx,"%%%d",(ulong)pVVar10->uniqueId);
        }
        else {
          Print(ctx,"%%%d (%.*s)",(ulong)pVVar10->uniqueId,
                (ulong)(uint)((int)(pVVar10->super_VmValue).comment.end -
                             (int)(pVVar10->super_VmValue).comment.begin),
                (pVVar10->super_VmValue).comment.begin);
        }
      }
      Print(ctx,"]");
    }
    else {
      Print(ctx,"%%%d",(ulong)pVVar2->uniqueId);
      if (pVVar2->color != 0) {
        Print(ctx,".c%d",(ulong)pVVar2->color);
      }
      bVar3 = SmallArray<unsigned_char,_8U>::empty(&pVVar2->regVmRegisters);
      if (!bVar3) {
        Print(ctx,".r");
        for (liveOut._4_4_ = 0; uVar4 = SmallArray<unsigned_char,_8U>::size(&pVVar2->regVmRegisters)
            , liveOut._4_4_ < uVar4; liveOut._4_4_ = liveOut._4_4_ + 1) {
          pcVar7 = "|%d";
          if (liveOut._4_4_ == 0) {
            pcVar7 = "%d";
          }
          pbVar8 = SmallArray<unsigned_char,_8U>::operator[](&pVVar2->regVmRegisters,liveOut._4_4_);
          Print(ctx,pcVar7,(ulong)*pbVar8);
        }
      }
      bVar3 = InplaceStr::empty(&(pVVar2->super_VmValue).comment);
      if (!bVar3) {
        Print(ctx," (%.*s)",
              (ulong)(uint)((int)(pVVar2->super_VmValue).comment.end -
                           (int)(pVVar2->super_VmValue).comment.begin),
              (pVVar2->super_VmValue).comment.begin);
      }
    }
  }
  PrintLine(ctx,"]");
  Print(ctx,"  // live variables going out: [");
  for (liveOut._0_4_ = 0; uVar4 = SmallArray<VmInstruction_*,_4U>::size(&block->liveOut),
      (uint)liveOut < uVar4; liveOut._0_4_ = (uint)liveOut + 1) {
    ppVVar6 = SmallArray<VmInstruction_*,_4U>::operator[](&block->liveOut,(uint)liveOut);
    pVVar2 = *ppVVar6;
    if ((uint)liveOut != 0) {
      Print(ctx,", ");
    }
    Print(ctx,"%%%d",(ulong)pVVar2->uniqueId);
    if (pVVar2->color != 0) {
      Print(ctx,".c%d",(ulong)pVVar2->color);
    }
    bVar3 = SmallArray<unsigned_char,_8U>::empty(&pVVar2->regVmRegisters);
    if (!bVar3) {
      Print(ctx,".r");
      for (value_1._4_4_ = 0; uVar4 = SmallArray<unsigned_char,_8U>::size(&pVVar2->regVmRegisters),
          value_1._4_4_ < uVar4; value_1._4_4_ = value_1._4_4_ + 1) {
        pcVar7 = "|%d";
        if (value_1._4_4_ == 0) {
          pcVar7 = "%d";
        }
        pbVar8 = SmallArray<unsigned_char,_8U>::operator[](&pVVar2->regVmRegisters,value_1._4_4_);
        Print(ctx,pcVar7,(ulong)*pbVar8);
      }
    }
    bVar3 = InplaceStr::empty(&(pVVar2->super_VmValue).comment);
    if (!bVar3) {
      Print(ctx," (%.*s)",
            (ulong)(uint)((int)(pVVar2->super_VmValue).comment.end -
                         (int)(pVVar2->super_VmValue).comment.begin),
            (pVVar2->super_VmValue).comment.begin);
    }
  }
  PrintLine(ctx,"]");
  for (local_98 = block->firstInstruction; local_98 != (VmInstruction *)0x0;
      local_98 = local_98->nextSibling) {
    if (((ctx->displayAsTree & 1U) == 0) ||
       (bVar3 = SmallArray<VmValue_*,_8U>::empty(&(local_98->super_VmValue).users), bVar3)) {
      PrintIndent(ctx);
      PrintInstruction(ctx,local_98);
    }
  }
  ctx->depth = ctx->depth - 1;
  PrintLine(ctx);
  return;
}

Assistant:

void PrintBlock(InstructionVMGraphContext &ctx, VmBlock *block)
{
	PrintUsers(ctx, block, false);

	PrintLine(ctx, "%.*s.b%d:", FMT_ISTR(block->name), block->uniqueId);

	ctx.depth++;

	Print(ctx, "  // predecessor blocks: [");

	for(unsigned i = 0; i < block->predecessors.size(); i++)
	{
		VmBlock *predecessor = block->predecessors[i];

		if(i != 0)
			Print(ctx, ", ");

		Print(ctx, "'%.*s.b%d'", FMT_ISTR(predecessor->name), predecessor->uniqueId);
	}

	PrintLine(ctx, "]");

	Print(ctx, "  // successor blocks: [");

	for(unsigned i = 0; i < block->successors.size(); i++)
	{
		VmBlock *successor = block->successors[i];

		if(i != 0)
			Print(ctx, ", ");

		Print(ctx, "'%.*s.b%d'", FMT_ISTR(successor->name), successor->uniqueId);
	}

	PrintLine(ctx, "]");

	Print(ctx, "  // immediate dominator: [");

	if(block->idom)
		Print(ctx, "'%.*s.b%d'", FMT_ISTR(block->idom->name), block->idom->uniqueId);

	PrintLine(ctx, "]");

	Print(ctx, "  // dominance frontier: [");

	for(unsigned i = 0; i < block->dominanceFrontier.size(); i++)
	{
		VmBlock *dominator = block->dominanceFrontier[i];

		if(i != 0)
			Print(ctx, ", ");

		Print(ctx, "'%.*s.b%d'", FMT_ISTR(dominator->name), dominator->uniqueId);
	}

	PrintLine(ctx, "]");

	Print(ctx, "  // dominance children: [");

	for(unsigned i = 0; i < block->dominanceChildren.size(); i++)
	{
		VmBlock *dominator = block->dominanceChildren[i];

		if(i != 0)
			Print(ctx, ", ");

		Print(ctx, "'%.*s.b%d'", FMT_ISTR(dominator->name), dominator->uniqueId);
	}

	PrintLine(ctx, "]");

	Print(ctx, "  // live variables going in: [");

	for(unsigned i = 0; i < block->liveIn.size(); i++)
	{
		VmInstruction *liveIn = block->liveIn[i];

		if(i != 0)
			Print(ctx, ", ");

		if(liveIn->cmd == VM_INST_PHI)
		{
			Print(ctx, "%%%d", liveIn->uniqueId);

			if(liveIn->color)
				Print(ctx, ".c%d", liveIn->color);

			if(!liveIn->regVmRegisters.empty())
			{
				Print(ctx, ".r");

				for(unsigned i = 0; i < liveIn->regVmRegisters.size(); i++)
					Print(ctx, i == 0 ? "%d" : "|%d", liveIn->regVmRegisters[i]);
			}

			if(liveIn->comment.empty())
				Print(ctx, " [");
			else
				Print(ctx, " (%.*s) [", FMT_ISTR(liveIn->comment));

			for(unsigned k = 0; k < liveIn->arguments.size(); k += 2)
			{
				VmInstruction *value = getType<VmInstruction>(liveIn->arguments[k]);

				if(k != 0)
					Print(ctx, ", ");

				if(value->comment.empty())
					Print(ctx, "%%%d", value->uniqueId);
				else
					Print(ctx, "%%%d (%.*s)", value->uniqueId, FMT_ISTR(value->comment));
			}

			Print(ctx, "]");
		}
		else
		{
			Print(ctx, "%%%d", liveIn->uniqueId);

			if(liveIn->color)
				Print(ctx, ".c%d", liveIn->color);

			if(!liveIn->regVmRegisters.empty())
			{
				Print(ctx, ".r");

				for(unsigned i = 0; i < liveIn->regVmRegisters.size(); i++)
					Print(ctx, i == 0 ? "%d" : "|%d", liveIn->regVmRegisters[i]);
			}

			if(!liveIn->comment.empty())
				Print(ctx, " (%.*s)", FMT_ISTR(liveIn->comment));
		}
	}

	PrintLine(ctx, "]");

	Print(ctx, "  // live variables going out: [");

	for(unsigned i = 0; i < block->liveOut.size(); i++)
	{
		VmInstruction *liveOut = block->liveOut[i];

		if(i != 0)
			Print(ctx, ", ");

		Print(ctx, "%%%d", liveOut->uniqueId);

		if(liveOut->color)
			Print(ctx, ".c%d", liveOut->color);

		if(!liveOut->regVmRegisters.empty())
		{
			Print(ctx, ".r");

			for(unsigned i = 0; i < liveOut->regVmRegisters.size(); i++)
				Print(ctx, i == 0 ? "%d" : "|%d", liveOut->regVmRegisters[i]);
		}

		if(!liveOut->comment.empty())
			Print(ctx, " (%.*s)", FMT_ISTR(liveOut->comment));
	}

	PrintLine(ctx, "]");

	for(VmInstruction *value = block->firstInstruction; value; value = value->nextSibling)
	{
		if(ctx.displayAsTree && !value->users.empty())
			continue;

		PrintIndent(ctx);
		PrintInstruction(ctx, value);
	}

	ctx.depth--;

	PrintLine(ctx);
}